

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

int sf_glad_gl_has_extension(int version,char *exts,uint num_exts_i,char **exts_i,char *ext)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long in_RCX;
  uint in_EDX;
  char *in_RSI;
  int in_EDI;
  char *in_R8;
  char *e;
  uint index;
  char *terminator;
  char *loc;
  char *extensions;
  uint local_44;
  char *local_30;
  int local_4;
  
  if (in_EDI / 10000 < 3) {
    if ((in_RSI == (char *)0x0) || (local_30 = in_RSI, in_R8 == (char *)0x0)) {
      local_4 = 0;
    }
    else {
      do {
        pcVar2 = strstr(local_30,in_R8);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        sVar3 = strlen(in_R8);
        pcVar4 = pcVar2 + sVar3;
      } while (((pcVar2 != local_30) && (local_30 = pcVar4, pcVar2[-1] != ' ')) ||
              ((*pcVar4 != ' ' && (local_30 = pcVar4, *pcVar4 != '\0'))));
      local_4 = 1;
    }
  }
  else {
    for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
      iVar1 = strcmp(*(char **)(in_RCX + (ulong)local_44 * 8),in_R8);
      if (iVar1 == 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int sf_glad_gl_has_extension(int version, const char *exts, unsigned int num_exts_i, char **exts_i, const char *ext) {
    if(GLAD_VERSION_MAJOR(version) < 3 || !SF_GLAD_GL_IS_SOME_NEW_VERSION) {
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }
        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }
            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
    } else {
        unsigned int index;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];
            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
    return 0;
}